

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_draw.c
# Opt level: O1

void swap_drawstring(char *str,guint8 *im,size_t w,size_t h)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  bmap_t *bm;
  guint8 gVar5;
  int iVar6;
  ulong uVar7;
  int extraout_EDX;
  ulong uVar8;
  guint8 *pgVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  size_t sVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  undefined1 auVar20 [12];
  FT_Face_conflict face;
  FT_Library lib;
  long local_98;
  long local_90;
  long local_88;
  ulong local_80;
  long local_78;
  FT_Bitmap *local_70;
  long local_68;
  guint8 *local_60;
  undefined8 local_58;
  long local_50;
  ulong local_48;
  long local_40;
  size_t local_38;
  
  uVar7 = 8;
  if (8 < h >> 6) {
    uVar7 = h >> 6;
  }
  uVar8 = (h >> 5) + 3;
  uVar13 = 0x14;
  if (0x21f < h) {
    uVar13 = uVar8 & 0xfffffffc;
  }
  uVar16 = 0x10;
  if (h < 0x440) {
    uVar16 = uVar7 & 0xffffffff;
  }
  if ((str != (char *)0x0) && (local_60 = im, iVar2 = FT_Init_FreeType(&local_58), iVar2 == 0)) {
    iVar2 = FT_New_Face(local_58,"/usr/local/lib/data/DroidSans-Bold.ttf",0,&local_90);
    if (iVar2 == 0) {
      if (0x20 < (uVar8 & 0xfffffffffffffffc)) {
        uVar13 = 0x20;
      }
      iVar2 = FT_Set_Pixel_Sizes(local_90,0,uVar13);
      if (iVar2 == 0) {
        lVar10 = *(long *)(local_90 + 0x98);
        local_38 = strlen(str);
        if (local_38 != 0) {
          iVar2 = (int)h;
          local_68 = (long)(int)w;
          sVar14 = 0;
          local_40 = (long)((iVar2 - (int)uVar16) + -3);
          do {
            uVar3 = FT_Get_Char_Index(local_90,(long)str[sVar14]);
            iVar4 = FT_Load_Glyph(local_90,uVar3,0);
            if ((iVar4 == 0) && (iVar4 = FT_Get_Glyph(lVar10,&local_98), iVar4 == 0)) {
              local_88 = local_98;
              iVar4 = FT_Glyph_To_Bitmap(&local_88,1,0,0);
              iVar15 = (int)uVar16;
              if (iVar4 == 0) {
                if ((*(char *)(local_88 + 0x4a) == '\x02') && (*(short *)(local_88 + 0x48) == 0x100)
                   ) {
                  local_70 = (FT_Bitmap *)(local_88 + 0x30);
                  local_80 = (ulong)*(uint *)(local_88 + 0x28);
                  local_78 = local_40 - *(int *)(local_88 + 0x2c);
                  iVar17 = *(int *)(local_88 + 0x34) + 4;
                  iVar4 = *(int *)(local_88 + 0x30) + 4;
                  local_50 = lVar10;
                  bm = (bmap_t *)g_malloc(0x10);
                  auVar20 = g_malloc((long)(iVar4 * iVar17));
                  bm->b = auVar20._0_8_;
                  bm->w = iVar17;
                  bm->h = iVar4;
                  ft2bmap(local_70,bm,auVar20._8_4_);
                  blur(bm->b,bm->w,bm->h);
                  blur(bm->b,bm->w,bm->h);
                  iVar4 = bm->h;
                  iVar17 = extraout_EDX;
                  if (0 < (long)iVar4) {
                    local_48 = (ulong)((int)local_80 + iVar15);
                    pgVar9 = local_60 + w * (local_78 + 1);
                    lVar10 = 0;
                    uVar7 = local_48;
                    do {
                      lVar11 = lVar10 + local_78 + 1;
                      if (lVar11 < 0) {
                        bVar1 = false;
                      }
                      else {
                        bVar1 = true;
                        if (lVar11 < iVar2) {
                          lVar11 = (long)bm->w;
                          bVar1 = false;
                          if (0 < lVar11) {
                            iVar17 = bm->w * (int)lVar10;
                            uVar8 = local_48;
                            do {
                              if ((long)uVar8 < 0) {
                                iVar18 = 7;
                              }
                              else {
                                iVar18 = 5;
                                if ((long)uVar8 < local_68) {
                                  uVar7 = (ulong)bm->b[iVar17];
                                  iVar6 = (uint)pgVar9[uVar8] - (uint)bm->b[iVar17];
                                  iVar18 = 0;
                                  gVar5 = (guint8)iVar6;
                                  if (iVar6 < 1) {
                                    gVar5 = '\0';
                                  }
                                  pgVar9[uVar8] = gVar5;
                                }
                              }
                              if ((iVar18 != 7) && (iVar18 != 0)) break;
                              iVar17 = iVar17 + 1;
                              uVar8 = uVar8 + 1;
                              lVar11 = lVar11 + -1;
                            } while (lVar11 != 0);
                          }
                        }
                      }
                      iVar17 = (int)uVar7;
                      if (bVar1) break;
                      lVar10 = lVar10 + 1;
                      pgVar9 = pgVar9 + w;
                    } while (lVar10 != iVar4);
                  }
                  ft2bmap(local_70,bm,iVar17);
                  blur(bm->b,bm->w,bm->h);
                  iVar4 = bm->h;
                  if (0 < (long)iVar4) {
                    pgVar9 = local_60 + w * (long)(int)local_78;
                    lVar10 = 0;
                    do {
                      lVar11 = lVar10 + (int)local_78;
                      if (lVar11 < 0) {
                        bVar1 = false;
                      }
                      else {
                        bVar1 = true;
                        if (lVar11 < iVar2) {
                          lVar11 = (long)bm->w;
                          bVar1 = false;
                          if (0 < lVar11) {
                            iVar17 = bm->w * (int)lVar10;
                            lVar12 = (long)((int)local_80 + iVar15 + -1);
                            do {
                              if (lVar12 < 0) {
                                iVar18 = 7;
                              }
                              else {
                                iVar18 = 5;
                                if (lVar12 < local_68) {
                                  uVar19 = (uint)pgVar9[lVar12] + (uint)bm->b[iVar17];
                                  if (0xfe < uVar19) {
                                    uVar19 = 0xff;
                                  }
                                  pgVar9[lVar12] = (guint8)uVar19;
                                  iVar18 = 0;
                                }
                              }
                              if ((iVar18 != 7) && (iVar18 != 0)) break;
                              iVar17 = iVar17 + 1;
                              lVar12 = lVar12 + 1;
                              lVar11 = lVar11 + -1;
                            } while (lVar11 != 0);
                          }
                        }
                      }
                      if (bVar1) break;
                      lVar10 = lVar10 + 1;
                      pgVar9 = pgVar9 + w;
                    } while (lVar10 != iVar4);
                  }
                  g_free(bm->b);
                  g_free(bm);
                  lVar10 = local_50;
                }
                FT_Done_Glyph(local_88);
              }
              uVar16 = (ulong)(uint)(iVar15 + (int)(*(ulong *)(lVar10 + 0x80) >> 6));
              FT_Done_Glyph(local_98);
            }
            sVar14 = sVar14 + 1;
          } while (sVar14 != local_38);
        }
      }
    }
    FT_Done_FreeType(local_58);
  }
  return;
}

Assistant:

void swap_drawstring(const char *str, guint8 *im, size_t w, size_t h) {
    size_t fs = ROUND_UPTO(h / 32, 4);
    size_t bd = CLAMP(h / 64, 8, 16);
    draw_string(P2SC_FONT_DROIDBOLD, CLAMP(fs, 20, 32), str, bd, h - 3 - bd, im, w, h);
}